

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::toDimacs(Solver *this,FILE *f,vec<Minisat::Lit,_int> *assumps)

{
  byte bVar1;
  uint *puVar2;
  bool bVar3;
  uint uVar4;
  Var VVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  Var max;
  uint local_4c;
  vec<int,_int> local_48;
  FILE *local_38;
  
  if (this->ok == false) {
    fwrite("p cnf 1 2\n1 0\n-1 0\n",0x13,1,(FILE *)f);
    return;
  }
  local_48.data = (int *)0x0;
  local_48.sz = 0;
  local_48.cap = 0;
  local_4c = 0;
  if ((this->clauses).sz < 1) {
    iVar8 = 0;
  }
  else {
    lVar7 = 0;
    iVar8 = 0;
    do {
      uVar9 = (this->clauses).data[lVar7];
      if ((this->ca).ra.sz <= uVar9) goto LAB_0010d2fb;
      bVar3 = satisfied(this,(Clause *)((this->ca).ra.memory + uVar9));
      iVar8 = iVar8 + (uint)!bVar3;
      lVar7 = lVar7 + 1;
      iVar10 = (this->clauses).sz;
    } while (lVar7 < iVar10);
    if (0 < iVar10) {
      lVar7 = 0;
      local_38 = (FILE *)f;
      do {
        uVar9 = (this->clauses).data[lVar7];
        if ((this->ca).ra.sz <= uVar9) goto LAB_0010d2fb;
        bVar3 = satisfied(this,(Clause *)((this->ca).ra.memory + uVar9));
        if (!bVar3) {
          uVar9 = (this->clauses).data[lVar7];
          if ((this->ca).ra.sz <= uVar9) goto LAB_0010d2fb;
          puVar2 = (this->ca).ra.memory;
          uVar4 = puVar2[uVar9];
          if (0x1f < uVar4) {
            puVar2 = puVar2 + uVar9;
            uVar11 = 0;
            do {
              uVar9 = puVar2[uVar11 + 1];
              iVar10 = (int)uVar9 >> 1;
              if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.
                  map.sz <= iVar10) goto LAB_0010d2dc;
              bVar1 = (this->assigns).
                      super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data
                      [iVar10].value;
              if ((((byte)uVar9 & 1 ^ bVar1) != l_False || (l_False & 2) != 0) &&
                  (l_False & 2 & bVar1) == 0) {
                mapVar(iVar10,&local_48,(Var *)&local_4c);
                uVar4 = *puVar2;
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 < uVar4 >> 5);
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (this->clauses).sz);
      uVar11 = (ulong)local_4c;
      f = (FILE *)local_38;
      goto LAB_0010d174;
    }
  }
  uVar11 = 0;
LAB_0010d174:
  uVar9 = iVar8 + assumps->sz;
  fprintf((FILE *)f,"p cnf %d %d\n",uVar11,(ulong)uVar9);
  if (0 < assumps->sz) {
    lVar7 = 0;
    do {
      uVar4 = assumps->data[lVar7].x;
      iVar8 = (int)uVar4 >> 1;
      if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <=
          iVar8) {
LAB_0010d2dc:
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x27,
                      "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                     );
      }
      bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
              data[iVar8].value;
      if (((byte)uVar4 & 1 ^ bVar1) == l_False && (l_False & 2) == 0 || (bVar1 & l_False & 2) != 0)
      {
        __assert_fail("value(assumps[i]) != l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                      ,0x3d3,"void Minisat::Solver::toDimacs(FILE *, const vec<Lit> &)");
      }
      VVar5 = mapVar(iVar8,&local_48,(Var *)&local_4c);
      pcVar6 = "-";
      if ((uVar4 & 1) == 0) {
        pcVar6 = "";
      }
      fprintf((FILE *)f,"%s%d 0\n",pcVar6,(ulong)(VVar5 + 1));
      lVar7 = lVar7 + 1;
    } while (lVar7 < assumps->sz);
  }
  if (0 < (this->clauses).sz) {
    lVar7 = 0;
    do {
      uVar4 = (this->clauses).data[lVar7];
      if ((this->ca).ra.sz <= uVar4) {
LAB_0010d2fb:
        __assert_fail("r < sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                      ,0x3f,
                      "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                     );
      }
      toDimacs(this,f,(Clause *)((this->ca).ra.memory + uVar4),&local_48,(Var *)&local_4c);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->clauses).sz);
  }
  if (0 < this->verbosity) {
    printf("Wrote DIMACS with %d variables and %d clauses.\n",(ulong)local_4c,(ulong)uVar9);
  }
  if (local_48.data != (int *)0x0) {
    local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
    free(local_48.data);
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, const vec<Lit>& assumps)
{
    // Handle case when solver is in contradictory state:
    if (!ok){
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return; }

    vec<Var> map; Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int cnt = 0;
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]]))
            cnt++;
        
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])){
            Clause& c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (value(c[j]) != l_False)
                    mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumps.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for (int i = 0; i < assumps.size(); i++){
        assert(value(assumps[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumps[i]) ? "-" : "", mapVar(var(assumps[i]), map, max)+1);
    }

    for (int i = 0; i < clauses.size(); i++)
        toDimacs(f, ca[clauses[i]], map, max);

    if (verbosity > 0)
        printf("Wrote DIMACS with %d variables and %d clauses.\n", max, cnt);
}